

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

CSVOption<unsigned_long> duckdb::CSVOption<unsigned_long>::Deserialize(Deserializer *deserializer)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  CSVOption<unsigned_long> CVar4;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"set_by_user");
  if ((char)uVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
  iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  CVar4.value._4_4_ = extraout_var;
  CVar4.value._0_4_ = iVar3;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  CVar4._4_4_ = 0;
  CVar4._0_4_ = uVar2;
  return CVar4;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}